

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O3

bool __thiscall diy::Direction::operator<(Direction *this,Direction *y)

{
  int *piVar1;
  int *piVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  bool bVar7;
  
  piVar2 = (this->super_DynamicPoint<int,_4UL>).
           super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
  uVar3 = (ulong)((long)(this->super_DynamicPoint<int,_4UL>).
                        super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_end - (long)piVar2
                 ) >> 2 & 0xffffffff;
  if (uVar3 == 0) {
    bVar7 = false;
  }
  else {
    piVar1 = (y->super_DynamicPoint<int,_4UL>).
             super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin;
    iVar4 = *piVar2;
    iVar6 = *piVar1;
    bVar7 = true;
    if (iVar6 <= iVar4) {
      bVar7 = true;
      uVar5 = 1;
      do {
        if (iVar6 < iVar4) {
          piVar2 = (int *)0x0;
          goto LAB_00123ff6;
        }
        bVar7 = uVar5 < uVar3;
        if (uVar5 == uVar3) goto LAB_00123ff6;
        iVar4 = piVar2[uVar5];
        iVar6 = piVar1[uVar5];
        uVar5 = uVar5 + 1;
      } while (iVar6 <= iVar4);
      piVar2 = (int *)0x1;
LAB_00123ff6:
      bVar7 = (bool)(bVar7 & (byte)piVar2);
    }
  }
  return bVar7;
}

Assistant:

bool
      operator<(const diy::Direction& y) const
      {
        for (size_t i = 0; i < dimension(); ++i)
        {
            if ((*this)[i] < y[i]) return true;
            if ((*this)[i] > y[i]) return false;
        }
        return false;
      }